

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

Result __thiscall
wabt::ReadFile(wabt *this,string_view filename,
              vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  FILE *pFVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  FILE *__stream;
  size_t sVar7;
  uchar *__ptr;
  long size;
  FILE *infile;
  stat statbuf;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_68;
  char *local_60;
  char *local_58;
  char *filename_cstr;
  string local_48 [8];
  string filename_str;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  string_view filename_local;
  Result res;
  
  filename_str.field_2._8_8_ = filename._M_str;
  filename_local._M_len = filename._M_len;
  out_data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&out_data_local,
             (allocator<char> *)((long)&filename_cstr + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&filename_cstr + 7));
  local_58 = (char *)std::__cxx11::string::c_str();
  local_68 = out_data_local;
  local_60 = (char *)filename_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"-");
  __x._M_str = local_60;
  __x._M_len = (size_t)local_68;
  bVar3 = std::operator==(__x,local_78);
  if (bVar3) {
    filename_local._M_str._4_4_ =
         ReadAll(_stdin,"stdin",
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)filename_str.field_2._8_8_
                );
  }
  else {
    iVar4 = stat(local_58,(stat *)&infile);
    pcVar2 = local_58;
    pFVar1 = _stderr;
    if (iVar4 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(pFVar1,"%s: %s\n",pcVar2,pcVar6);
      Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
    }
    else if (((uint)statbuf.st_nlink & 0x4000) == 0) {
      __stream = fopen(local_58,"rb");
      pcVar2 = local_58;
      pFVar1 = _stderr;
      if (__stream == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s: %s\n",pcVar2,pcVar6);
        Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
      }
      else {
        iVar4 = fseek(__stream,0,2);
        if (iVar4 < 0) {
          filename_local._M_str._4_4_ =
               ReadAll((FILE *)__stream,local_58,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       filename_str.field_2._8_8_);
          fclose(__stream);
        }
        else {
          sVar7 = ftell(__stream);
          if ((long)sVar7 < 0) {
            perror("ftell failed");
            fclose(__stream);
            Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
          }
          else {
            iVar4 = fseek(__stream,0,0);
            if (iVar4 < 0) {
              perror("fseek to beginning failed");
              fclose(__stream);
              Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
            }
            else {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         filename_str.field_2._8_8_,sVar7);
              if (sVar7 != 0) {
                __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   filename_str.field_2._8_8_);
                sVar7 = fread(__ptr,sVar7,1,__stream);
                pcVar2 = local_58;
                pFVar1 = _stderr;
                if (sVar7 != 1) {
                  piVar5 = __errno_location();
                  pcVar6 = strerror(*piVar5);
                  fprintf(pFVar1,"%s: fread failed: %s\n",pcVar2,pcVar6);
                  fclose(__stream);
                  Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
                  goto LAB_00155a5a;
                }
              }
              fclose(__stream);
              Result::Result((Result *)((long)&filename_local._M_str + 4),Ok);
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"%s: is a directory\n",local_58);
      Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
    }
  }
LAB_00155a5a:
  statbuf.__glibc_reserved[2]._4_4_ = 1;
  std::__cxx11::string::~string(local_48);
  return (Result)filename_local._M_str._4_4_;
}

Assistant:

Result ReadFile(std::string_view filename, std::vector<uint8_t>* out_data) {
  std::string filename_str(filename);
  const char* filename_cstr = filename_str.c_str();

  if (filename == "-") {
    return ReadAll(stdin, "stdin", out_data);
  }

  struct stat statbuf;
  if (stat(filename_cstr, &statbuf) < 0) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (statbuf.st_mode & S_IFDIR) {
    fprintf(stderr, "%s: is a directory\n", filename_cstr);
    return Result::Error;
  }

  FILE* infile = fopen(filename_cstr, "rb");
  if (!infile) {
    fprintf(stderr, "%s: %s\n", filename_cstr, strerror(errno));
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_END) < 0) {
    // not seekable, so we can't pre-allocate out_data, but let's try and read
    // it anyway (for pipes, sockets, etc.)
    auto res = ReadAll(infile, filename_cstr, out_data);
    fclose(infile);
    return res;
  }

  long size = ftell(infile);
  if (size < 0) {
    perror("ftell failed");
    fclose(infile);
    return Result::Error;
  }

  if (fseek(infile, 0, SEEK_SET) < 0) {
    perror("fseek to beginning failed");
    fclose(infile);
    return Result::Error;
  }

  out_data->resize(size);
  if (size != 0 && fread(out_data->data(), size, 1, infile) != 1) {
    fprintf(stderr, "%s: fread failed: %s\n", filename_cstr, strerror(errno));
    fclose(infile);
    return Result::Error;
  }

  fclose(infile);
  return Result::Ok;
}